

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* nivalis::OpCode::funcname_to_opcode_map_abi_cxx11_(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  int iVar1;
  _OpCode *in_stack_fffffffffffff6c0;
  undefined8 **ppuVar2;
  char (*in_stack_fffffffffffff6c8) [10];
  undefined8 **ppuVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff6d0;
  allocator_type *in_stack_fffffffffffff6e0;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 *local_830 [260];
  undefined8 *local_10;
  undefined8 local_8;
  
  if (funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [3])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[3],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [3])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [8])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [9])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[6],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [6])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[10],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [2])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[4],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [4])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar11 = 0x4002;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar10 = 0x4003;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar9 = 0x4004;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[7],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [7])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar8 = 0x801f;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [9])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar7 = 0x801e;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[8],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [8])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar6 = 0x8020;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[9],_nivalis::OpCode::_OpCode,_true>
                (in_stack_fffffffffffff6d0,(char (*) [9])in_stack_fffffffffffff6c8,
                 in_stack_fffffffffffff6c0);
      uVar5 = 0xffffffff;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[5],_int,_true>
                (in_stack_fffffffffffff6d0,(char (*) [5])in_stack_fffffffffffff6c8,
                 (int *)in_stack_fffffffffffff6c0);
      uVar4 = 0xffffffff;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair<const_char_(&)[2],_int,_true>
                (in_stack_fffffffffffff6d0,(char (*) [2])in_stack_fffffffffffff6c8,
                 (int *)in_stack_fffffffffffff6c0);
      local_10 = local_830;
      local_8 = 0x34;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
      ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                   *)0x11b420);
      __l._M_array._4_4_ = uVar9;
      __l._M_array._0_4_ = uVar8;
      __l._M_len._0_4_ = uVar10;
      __l._M_len._4_4_ = uVar11;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT44(uVar7,uVar6),__l,(less<void> *)CONCAT44(uVar5,uVar4),
            in_stack_fffffffffffff6e0);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    *)0x11b452);
      ppuVar3 = (undefined8 **)local_830;
      ppuVar2 = &local_10;
      do {
        ppuVar2 = ppuVar2 + -5;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                 *)0x11b47d);
      } while (ppuVar2 != ppuVar3);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::~map,&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_);
    }
  }
  return &funcname_to_opcode_map[abi:cxx11]()::func_opcodes_abi_cxx11_;
}

Assistant:

const std::map<std::string, uint32_t, std::less<> >& funcname_to_opcode_map() {
    static std::map<std::string, uint32_t, std::less<> > func_opcodes = {
        {"mod", OpCode::mod},
        {"pow", OpCode::power},
        {"log", OpCode::logbase},
        {"max", OpCode::max},
        {"min", OpCode::min},
        {"xor", OpCode::lxor},
        {"not", OpCode::lnot},
        {"and", OpCode::land},
        {"or", OpCode::lor},

        {"abs", OpCode::absb},
        {"sqrt", OpCode::sqrtb},
        {"sgn", OpCode::sgn},
        {"floor", OpCode::floorb},
        {"ceil", OpCode::ceilb},
        {"round", OpCode::roundb},

        {"exp", OpCode::expb},
        {"exp2", OpCode::exp2b},
        {"ln", OpCode::logb},
        {"log10", OpCode::log10b},
        {"log2", OpCode::log2b},

        {"sin", OpCode::sinb},
        {"cos", OpCode::cosb},
        {"tan", OpCode::tanb},
        {"arcsin", OpCode::asinb},
        {"arccos", OpCode::acosb},
        {"arctan", OpCode::atanb},

        {"sinh", OpCode::sinhb},
        {"cosh", OpCode::coshb},
        {"tanh", OpCode::tanhb},

        {"gamma", OpCode::tgammab},
        {"Gamma", OpCode::tgammab},
        {"ifact", OpCode::factb},
        {"lgamma", OpCode::lgammab},
        {"digamma", OpCode::digammab},
        {"psi_0", OpCode::digammab},
        {"trigamma", OpCode::trigammab},
        {"psi_1", OpCode::trigammab},
        {"polygamma", OpCode::polygammab},
        {"erf", OpCode::erfb},
        {"zeta", OpCode::zetab},
        {"beta", OpCode::betab},
        {"B", OpCode::betab},
        {"gcd", OpCode::gcd},
        {"lcm", OpCode::lcm},
        {"choose", OpCode::choose},
        {"fafact", OpCode::fafact},
        {"rifact", OpCode::rifact},
        {"softplus", OpCode::softplusb},
        {"sigmoid", OpCode::sigmoidb},
        {"gausspdf", OpCode::gausspdfb},

        // -1 means fake command handled in parser
        {"fact", -1},
        {"N", -1}, // standard normal
    };
    return func_opcodes;
}